

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

char * UnicodeToString(char *cc)

{
  char cVar1;
  uint uVar2;
  undefined8 in_RAX;
  size_t sVar3;
  ulong uVar4;
  undefined8 uStack_28;
  int size;
  
  uStack_28 = in_RAX;
  sVar3 = strlen(cc);
  TArray<char,_char>::Resize(&out,(int)sVar3 + 1);
  uVar4 = 0;
  for (; *cc != '\0'; cc = cc + size) {
    uVar2 = utf8_decode(cc,&size);
    cVar1 = (char)uVar2;
    if (0xff < uVar2) {
      cVar1 = '?';
    }
    out.Array[uVar4] = cVar1;
    uVar4 = uVar4 + 1;
  }
  out.Array[uVar4 & 0xffffffff] = '\0';
  return out.Array;
}

Assistant:

static const char *UnicodeToString(const char *cc)
{
	out.Resize((unsigned)strlen(cc) + 1);
	int ndx = 0;
	while (*cc != 0)
	{
		int size;
		int c = utf8_decode(cc, &size);
		if (c < 0 || c > 255) c = '?';
		out[ndx++] = c;
		cc += size;
	}
	out[ndx] = 0;
	return &out[0];
}